

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderRenderCase.cpp
# Opt level: O2

void __thiscall
deqp::gls::ShaderRenderCase::render
          (ShaderRenderCase *this,Surface *result,int programID,QuadGrid *quadGrid)

{
  int numComponents;
  RenderContext *context;
  ShaderRenderCase *pSVar1;
  int iVar2;
  deUint32 dVar3;
  int iVar4;
  int iVar5;
  deUint32 dVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar9;
  long lVar10;
  long lVar11;
  int local_130;
  allocator<char> local_129;
  string name;
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> vertexArrays;
  undefined1 local_c8 [8];
  IndexType local_c0;
  pointer local_b8;
  ShaderRenderCase *local_78;
  Surface *local_70;
  ulong local_68;
  string local_60;
  Random rnd;
  long lVar8;
  
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar2);
  dVar3 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar3,"pre render",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderRenderCase.cpp"
                  ,0x252);
  iVar2 = result->m_width;
  iVar7 = result->m_height;
  local_70 = result;
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar4 = *(int *)CONCAT44(extraout_var_00,iVar4);
  iVar5 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar5 = *(int *)(CONCAT44(extraout_var_01,iVar5) + 4);
  dVar3 = deStringHash((this->m_vertShaderSource)._M_dataplus._M_p);
  dVar6 = deStringHash((this->m_fragShaderSource)._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar3 + dVar6);
  iVar4 = de::Random::getInt((Random *)&rnd.m_rnd,0,iVar4 - iVar2);
  iVar5 = de::Random::getInt((Random *)&rnd.m_rnd,0,iVar5 - iVar7);
  (**(code **)(lVar8 + 0x1a00))(iVar4,iVar5,iVar2,iVar7);
  (*(this->super_TestCase).super_TestNode._vptr_TestNode[7])
            (this,(ulong)(uint)programID,&quadGrid->m_constCoords);
  setupDefaultInputs(this,programID);
  (**(code **)(lVar8 + 0x1c0))
            ((this->m_clearColor).m_data[0],(this->m_clearColor).m_data[1],
             (this->m_clearColor).m_data[2],(this->m_clearColor).m_data[3]);
  (**(code **)(lVar8 + 0x188))(0x4000);
  vertexArrays.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vertexArrays.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vertexArrays.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar2 = quadGrid->m_numVertices;
  local_68 = (ulong)(uint)quadGrid->m_numTriangles;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"a_position",(allocator<char> *)&local_60);
  glu::va::Float((VertexArrayBinding *)local_c8,&name,4,iVar2,0,
                 ((quadGrid->m_positions).
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->m_data);
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
  emplace_back<glu::VertexArrayBinding>(&vertexArrays,(VertexArrayBinding *)local_c8);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"a_coords",(allocator<char> *)&local_60);
  glu::va::Float((VertexArrayBinding *)local_c8,&name,4,iVar2,0,
                 ((quadGrid->m_coords).
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->m_data);
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
  emplace_back<glu::VertexArrayBinding>(&vertexArrays,(VertexArrayBinding *)local_c8);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"a_unitCoords",(allocator<char> *)&local_60);
  glu::va::Float((VertexArrayBinding *)local_c8,&name,4,iVar2,0,
                 ((quadGrid->m_unitCoords).
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->m_data);
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
  emplace_back<glu::VertexArrayBinding>(&vertexArrays,(VertexArrayBinding *)local_c8);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"a_one",(allocator<char> *)&local_60);
  glu::va::Float((VertexArrayBinding *)local_c8,&name,1,iVar2,0,
                 (quadGrid->m_attribOne).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start);
  local_78 = this;
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
  emplace_back<glu::VertexArrayBinding>(&vertexArrays,(VertexArrayBinding *)local_c8);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&name);
  local_130 = 0;
  while( true ) {
    if ((int)((ulong)((long)(quadGrid->m_userAttribTransforms).
                            super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(quadGrid->m_userAttribTransforms).
                           super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 6) <= local_130) break;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_c8,"a_in",&local_129);
    de::toString<int>(&local_60,&local_130);
    std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_c8,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)local_c8);
    glu::va::Float((VertexArrayBinding *)local_c8,&name,4,iVar2,0,
                   (quadGrid->m_userAttribs[local_130].
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->m_data);
    std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
    emplace_back<glu::VertexArrayBinding>(&vertexArrays,(VertexArrayBinding *)local_c8);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&name);
    local_130 = local_130 + 1;
  }
  for (lVar11 = 0; pSVar1 = local_78, lVar11 != 9; lVar11 = lVar11 + 1) {
    iVar7 = (**(code **)(lVar8 + 0x780))
                      (programID,
                       (&getDefaultVertexArrays(glw::Functions_const&,deqp::gls::QuadGrid_const&,unsigned_int,std::vector<glu::VertexArrayBinding,std::allocator<glu::VertexArrayBinding>>&)
                         ::matrices)[lVar11 * 2]);
    if (-1 < iVar7) {
      numComponents = (&DAT_00c4140c)[lVar11 * 4];
      uVar9 = (ulong)(uint)(&DAT_00c41408)[lVar11 * 4];
      if ((int)(&DAT_00c41408)[lVar11 * 4] < 1) {
        uVar9 = 0;
      }
      for (lVar10 = 0; uVar9 * 0x18 - lVar10 != 0; lVar10 = lVar10 + 0x18) {
        glu::va::Float((VertexArrayBinding *)local_c8,iVar7,numComponents,iVar2,0x10,
                       *(float **)
                        ((long)&quadGrid->m_userAttribs[0].
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar10));
        std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
        emplace_back<glu::VertexArrayBinding>(&vertexArrays,(VertexArrayBinding *)local_c8);
        std::__cxx11::string::~string((string *)&local_c0);
        iVar7 = iVar7 + 1;
      }
    }
  }
  local_c8._4_4_ = (int)local_68 * 3;
  local_b8 = (quadGrid->m_indices).
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_c8._0_4_ = TYPE_LOCATION;
  local_c0 = INDEXTYPE_UINT16;
  glu::draw(local_78->m_renderCtx,programID,
            (int)(((long)vertexArrays.
                         super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)vertexArrays.
                        super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x50),
            vertexArrays.
            super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
            _M_impl.super__Vector_impl_data._M_start,(PrimitiveList *)local_c8,
            (DrawUtilCallback *)0x0);
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::~vector
            (&vertexArrays);
  dVar3 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar3,"draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderRenderCase.cpp"
                  ,0x273);
  context = pSVar1->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)local_c8,local_70);
  glu::readPixels(context,iVar4,iVar5,(PixelBufferAccess *)local_c8);
  dVar3 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar3,"post render",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderRenderCase.cpp"
                  ,0x278);
  return;
}

Assistant:

void ShaderRenderCase::render (Surface& result, int programID, const QuadGrid& quadGrid)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	GLU_EXPECT_NO_ERROR(gl.getError(), "pre render");

	// Buffer info.
	int				width		= result.getWidth();
	int				height		= result.getHeight();

	int				xOffsetMax	= m_renderCtx.getRenderTarget().getWidth() - width;
	int				yOffsetMax	= m_renderCtx.getRenderTarget().getHeight() - height;

	deUint32		hash		= deStringHash(m_vertShaderSource.c_str()) + deStringHash(m_fragShaderSource.c_str());
	de::Random		rnd			(hash);

	int				xOffset		= rnd.getInt(0, xOffsetMax);
	int				yOffset		= rnd.getInt(0, yOffsetMax);

	gl.viewport(xOffset, yOffset, width, height);

	// Setup program.
	setupUniforms(programID, quadGrid.getConstCoords());
	setupDefaultInputs(programID);

	// Clear.
	gl.clearColor(m_clearColor.x(), m_clearColor.y(), m_clearColor.z(), m_clearColor.w());
	gl.clear(GL_COLOR_BUFFER_BIT);

	// Draw.
	{
		std::vector<VertexArrayBinding>	vertexArrays;
		const int						numElements		= quadGrid.getNumTriangles()*3;

		getDefaultVertexArrays(gl, quadGrid, programID, vertexArrays);
		draw(m_renderCtx, programID, (int)vertexArrays.size(), &vertexArrays[0], pr::Triangles(numElements, quadGrid.getIndices()));
	}
	GLU_EXPECT_NO_ERROR(gl.getError(), "draw");

	// Read back results.
	glu::readPixels(m_renderCtx, xOffset, yOffset, result.getAccess());

	GLU_EXPECT_NO_ERROR(gl.getError(), "post render");
}